

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_decoder_seek_bytes(ma_decoder *pDecoder,int byteOffset,ma_seek_origin origin)

{
  ma_bool32 mVar1;
  ma_bool32 wasSuccessful;
  ma_seek_origin origin_local;
  int byteOffset_local;
  ma_decoder *pDecoder_local;
  
  if (pDecoder == (ma_decoder *)0x0) {
    __assert_fail("pDecoder != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                  ,0xb277,"ma_bool32 ma_decoder_seek_bytes(ma_decoder *, int, ma_seek_origin)");
  }
  mVar1 = (*pDecoder->onSeek)(pDecoder,byteOffset,origin);
  if (mVar1 != 0) {
    if (origin == ma_seek_origin_start) {
      pDecoder->readPointerInBytes = (long)byteOffset;
    }
    else {
      pDecoder->readPointerInBytes = (long)byteOffset + pDecoder->readPointerInBytes;
    }
  }
  return mVar1;
}

Assistant:

static ma_bool32 ma_decoder_seek_bytes(ma_decoder* pDecoder, int byteOffset, ma_seek_origin origin)
{
    ma_bool32 wasSuccessful;

    MA_ASSERT(pDecoder != NULL);

    wasSuccessful = pDecoder->onSeek(pDecoder, byteOffset, origin);
    if (wasSuccessful) {
        if (origin == ma_seek_origin_start) {
            pDecoder->readPointerInBytes = (ma_uint64)byteOffset;
        } else {
            pDecoder->readPointerInBytes += byteOffset;
        }
    }

    return wasSuccessful;
}